

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void translateColumnToCopy(Parse *pParse,int iStart,int iTabCur,int iRegister,int iAutoidxCur)

{
  Vdbe *pVVar1;
  Op *pOVar2;
  int iVar3;
  
  pVVar1 = pParse->pVdbe;
  if (pVVar1->db->mallocFailed == '\0') {
    pOVar2 = pVVar1->aOp + iStart;
  }
  else {
    pOVar2 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  iVar3 = pVVar1->nOp - iStart;
  if ((iVar3 != 0 && iStart <= pVVar1->nOp) && pParse->db->mallocFailed == '\0') {
    do {
      if (pOVar2->p1 == iTabCur) {
        if (pOVar2->opcode == 0x87) {
          pOVar2->opcode = '~';
          pOVar2->p1 = iAutoidxCur;
        }
        else if (pOVar2->opcode == '^') {
          pOVar2->opcode = 'P';
          pOVar2->p1 = pOVar2->p2 + iRegister;
          pOVar2->p2 = pOVar2->p3;
          pOVar2->p3 = 0;
          pOVar2->p5 = 2;
        }
      }
      pOVar2 = pOVar2 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

static void translateColumnToCopy(
  Parse *pParse,      /* Parsing context */
  int iStart,         /* Translate from this opcode to the end */
  int iTabCur,        /* OP_Column/OP_Rowid references to this table */
  int iRegister,      /* The first column is in this register */
  int iAutoidxCur     /* If non-zero, cursor of autoindex being generated */
){
  Vdbe *v = pParse->pVdbe;
  VdbeOp *pOp = sqlite3VdbeGetOp(v, iStart);
  int iEnd = sqlite3VdbeCurrentAddr(v);
  if( pParse->db->mallocFailed ) return;
  for(; iStart<iEnd; iStart++, pOp++){
    if( pOp->p1!=iTabCur ) continue;
    if( pOp->opcode==OP_Column ){
      pOp->opcode = OP_Copy;
      pOp->p1 = pOp->p2 + iRegister;
      pOp->p2 = pOp->p3;
      pOp->p3 = 0;
      pOp->p5 = 2;  /* Cause the MEM_Subtype flag to be cleared */
    }else if( pOp->opcode==OP_Rowid ){
      pOp->opcode = OP_Sequence;
      pOp->p1 = iAutoidxCur;
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
      if( iAutoidxCur==0 ){
        pOp->opcode = OP_Null;
        pOp->p3 = 0;
      }
#endif
    }
  }
}